

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void __thiscall AWeapon::CallEndPowerup(AWeapon *this)

{
  VMFunction *func;
  PClass *pPVar1;
  VMFrameStack *this_00;
  VMValue params [1];
  
  if (CallEndPowerup::VIndex == 0xffffffff) {
    CallEndPowerup::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"EndPowerup");
    if (CallEndPowerup::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x33d,"void AWeapon::CallEndPowerup()");
    }
  }
  pPVar1 = DObject::GetClass((DObject *)this);
  if ((CallEndPowerup::VIndex < (pPVar1->Virtuals).Count) &&
     (func = (pPVar1->Virtuals).Array[CallEndPowerup::VIndex], func != (VMFunction *)0x0)) {
    params[0].field_0.field_1.atag = 1;
    params[0].field_0.field_3.Type = '\x03';
    params[0].field_0._0_8_ = this;
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,func,params,1,(VMReturn *)0x0,0,(VMException **)0x0);
    VMValue::~VMValue(params);
    return;
  }
  (*(this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
    _vptr_DObject[0x31])(this);
  return;
}

Assistant:

void AWeapon::CallEndPowerup()
{
	IFVIRTUAL(AWeapon, EndPowerup)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[1] = { (DObject*)this };
		GlobalVMStack.Call(func, params, 1, nullptr, 0, nullptr);
	}
	else EndPowerup();
}